

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule_impl.h
# Opt level: O0

void __thiscall icu_63::RuleChain::RuleChain(RuleChain *this)

{
  RuleChain *this_local;
  
  this->_vptr_RuleChain = (_func_int **)&PTR__RuleChain_004a0b18;
  UnicodeString::UnicodeString(&this->fKeyword);
  this->fNext = (RuleChain *)0x0;
  this->ruleHeader = (OrConstraint *)0x0;
  UnicodeString::UnicodeString(&this->fDecimalSamples);
  UnicodeString::UnicodeString(&this->fIntegerSamples);
  this->fDecimalSamplesUnbounded = '\0';
  this->fIntegerSamplesUnbounded = '\0';
  this->fInternalStatus = U_ZERO_ERROR;
  return;
}

Assistant:

RuleChain() = default;